

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O0

void compFG(double **U,double **V,double **F,double **G,char **FLAG,double delt,lattice *grid,
           fluidSim *simulation)

{
  byte bVar1;
  long in_RCX;
  long *in_RDX;
  double **in_RSI;
  double **in_RDI;
  long in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int j;
  int i;
  short flag;
  double dySqrd;
  double dxSqrd;
  double duvy;
  double duvx;
  double dv2y;
  double du2x;
  double d2vy;
  double d2vx;
  double d2uy;
  double d2ux;
  int local_94;
  int local_90;
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  double **in_stack_ffffffffffffffb8;
  
  dVar2 = sqr(*in_R9);
  dVar3 = sqr(in_R9[1]);
  for (local_90 = 0; local_90 <= *(int *)(in_R9 + 4); local_90 = local_90 + 1) {
    for (local_94 = 1; local_94 <= *(int *)((long)in_R9 + 0x24); local_94 = local_94 + 1) {
      bVar1 = *(byte *)(*(long *)(in_R8 + (long)local_90 * 8) + (long)local_94);
      if (bVar1 == 0xf) {
        dVar5 = in_RDI[local_90 + 2][local_94];
        dVar6 = in_RDI[local_90 + 1][local_94];
        dVar7 = in_RDI[local_90][local_94];
        in_stack_ffffffffffffffb8 =
             (double **)
             (((in_RDI[local_90 + 1][local_94 + 1] -
               (in_RDI[local_90 + 1][local_94] + in_RDI[local_90 + 1][local_94])) +
              in_RDI[local_90 + 1][local_94 + -1]) / dVar3);
        dVar4 = delUVbyDelZ(in_RDI,in_RSI,local_90,local_94,2,_i[7],in_R9[1]);
        in_stack_ffffffffffffffa0 =
             delXSqrdByDelZ(in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                            (int)in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        *(double *)(in_RDX[local_90] + (long)local_94 * 8) =
             in_XMM0_Qa *
             ((((((dVar5 - (dVar6 + dVar6)) + dVar7) / dVar2 + (double)in_stack_ffffffffffffffb8) /
                *_i - in_stack_ffffffffffffffa0) - dVar4) + _i[3]) + in_RDI[local_90 + 1][local_94];
      }
      else if ((bVar1 & 2) == 0) {
        if ((bVar1 & 8) != 0) {
          *(double *)(in_RDX[local_90 + -1] + (long)local_94 * 8) = in_RDI[local_90][local_94];
        }
      }
      else {
        *(double *)(in_RDX[local_90] + (long)local_94 * 8) = in_RDI[local_90 + 1][local_94];
      }
    }
  }
  for (local_90 = 1; local_90 <= *(int *)(in_R9 + 4); local_90 = local_90 + 1) {
    for (local_94 = 0; local_94 <= *(int *)((long)in_R9 + 0x24); local_94 = local_94 + 1) {
      bVar1 = *(byte *)(*(long *)(in_R8 + (long)local_90 * 8) + (long)local_94);
      if (bVar1 == 0xf) {
        dVar5 = ((in_RSI[local_90 + 1][local_94 + 1] -
                 (in_RSI[local_90][local_94 + 1] + in_RSI[local_90][local_94 + 1])) +
                in_RSI[local_90 + -1][local_94 + 1]) / dVar2;
        dVar6 = ((in_RSI[local_90][local_94 + 2] -
                 (in_RSI[local_90][local_94 + 1] + in_RSI[local_90][local_94 + 1])) +
                in_RSI[local_90][local_94]) / dVar3;
        dVar7 = delUVbyDelZ(in_RDI,in_RSI,local_90,local_94,1,_i[7],*in_R9);
        in_stack_ffffffffffffff98 =
             delXSqrdByDelZ(in_stack_ffffffffffffffb8,(int)((ulong)dVar5 >> 0x20),SUB84(dVar5,0),
                            (int)((ulong)dVar6 >> 0x20),in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98);
        *(double *)(*(long *)(in_RCX + (long)local_90 * 8) + (long)local_94 * 8) =
             in_XMM0_Qa * ((((dVar5 + dVar6) / *_i - in_stack_ffffffffffffff98) - dVar7) + _i[4]) +
             in_RSI[local_90][local_94 + 1];
      }
      else if ((bVar1 & 1) == 0) {
        if ((bVar1 & 4) != 0) {
          *(double *)(*(long *)(in_RCX + (long)local_90 * 8) + (long)(local_94 + -1) * 8) =
               in_RSI[local_90 + -1][local_94];
        }
      }
      else {
        *(double *)(*(long *)(in_RCX + (long)local_90 * 8) + (long)local_94 * 8) =
             in_RSI[local_90][local_94 + 1];
      }
    }
  }
  if (((ulong)in_R9[5] & 4) != 0) {
    for (local_94 = 0; local_94 < *(int *)((long)in_R9 + 0x24) + 1; local_94 = local_94 + 1) {
      *(double *)(*in_RDX + (long)local_94 * 8) = in_RDI[1][local_94];
    }
  }
  if (((ulong)in_R9[5] & 8) != 0) {
    for (local_94 = 0; local_94 < *(int *)((long)in_R9 + 0x24) + 1; local_94 = local_94 + 1) {
      *(double *)(in_RDX[*(int *)(in_R9 + 4)] + (long)local_94 * 8) =
           in_RDI[*(int *)(in_R9 + 4) + 1][local_94];
    }
  }
  if (((ulong)in_R9[5] & 2) != 0) {
    for (local_90 = 0; local_90 < *(int *)(in_R9 + 4) + 1; local_90 = local_90 + 1) {
      **(double **)(in_RCX + (long)local_90 * 8) = in_RSI[local_90][1];
    }
  }
  if (((ulong)in_R9[5] & 1) != 0) {
    for (local_90 = 0; local_90 < *(int *)(in_R9 + 4) + 1; local_90 = local_90 + 1) {
      *(double *)(*(long *)(in_RCX + (long)local_90 * 8) + (long)*(int *)((long)in_R9 + 0x24) * 8) =
           in_RSI[local_90][*(int *)((long)in_R9 + 0x24) + 1];
    }
  }
  return;
}

Assistant:

void    compFG (REAL **U, REAL **V, REAL **F, REAL **G, char **FLAG, REAL delt,
		lattice *grid, fluidSim *simulation)
{
	/* Compute the auxiliary arrays F and G */
	REAL d2ux, d2uy, d2vx, d2vy;
	REAL du2x, dv2y;
	REAL duvx, duvy;
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	short flag;
	int i,j;
	for (i = 0; i <= grid->deli; i++)
	{
		for (j = 1; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* !! Notice: The index of F is shifted to match that of U! This computes the boundary condition of U!
				 * Therefore there is no shift in i-direction here!! */
				d2ux = (U[i+2][j] - 2*U[i+1][j] + U[i][j])/dxSqrd;
				d2uy = (U[i+1][j+1] - 2*U[i+1][j] + U[i+1][j-1])/dySqrd;

				duvy = delUVbyDelZ(U,V,i,j,DERIVE_BY_Y,simulation->alpha,grid->dely);
				du2x = delXSqrdByDelZ(U,i+1,j,DERIVE_BY_X,simulation->alpha,grid->delx);

				F[i][j] = U[i+1][j] + delt*((d2ux+d2uy)/simulation->Re - du2x - duvy + simulation->GX);
			}
			else if (flag & B_O)       /* East */
				F[i][j] = U[i+1][j];
			else if (flag & B_W)  /* West */
				F[i-1][j] = U[i][j];
		}
	}
	for (i = 1; i <= grid->deli; i++)
	{
		for (j = 0; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* A similar shift holds for G, except in the j-direction! */
				d2vx = (V[i+1][j+1] - 2*V[i][j+1] + V[i-1][j+1])/dxSqrd;
				d2vy = (V[i][j+2] - 2*V[i][j+1] + V[i][j])/dySqrd;

				duvx = delUVbyDelZ(U,V,i,j,DERIVE_BY_X,simulation->alpha,grid->delx);
				dv2y = delXSqrdByDelZ(V,i,j+1,DERIVE_BY_Y,simulation->alpha,grid->dely);

				G[i][j] = V[i][j+1] + delt*((d2vx+d2vy)/simulation->Re - dv2y - duvx + simulation->GY);
			}
			else if (flag & B_N)       /* North */
				G[i][j] = V[i][j+1];
			else if (flag & B_S)  /* South */
				G[i][j-1] = V[i-1][j];
		}
	}
	if (grid->edges & LEFT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[0][j] = U[1][j];
	}
	if (grid->edges & RIGHT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[grid->deli][j] = U[grid->deli+1][j];
	}
	if (grid->edges & BOTTOM)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][0] = V[i][1];
	}
	if (grid->edges & TOP)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][grid->delj] = V[i][grid->delj+1];
	}
	return;
}